

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O3

void hurtmarmor(monst *mdef,int attk)

{
  uint uVar1;
  
  uVar1 = mt_random();
  (*(code *)(&DAT_002d7848 + *(int *)(&DAT_002d7848 + (ulong)(uVar1 % 5) * 4)))();
  return;
}

Assistant:

void hurtmarmor(struct monst *mdef, int attk)
{
	int	hurt;
	struct obj *target;

	switch(attk) {
	    /* 0 is burning, which we should never be called with */
	    case AD_RUST: hurt = 1; break;
	    case AD_CORR: hurt = 3; break;
	    default: hurt = 2; break;
	}
	/* What the following code does: it keeps looping until it
	 * finds a target for the rust monster.
	 * Head, feet, etc... not covered by metal, or covered by
	 * rusty metal, are not targets.  However, your body always
	 * is, no matter what covers it.
	 */
	while (1) {
	    switch(rn2(5)) {
	    case 0:
		target = which_armor(mdef, W_ARMH);
		if (!target || !rust_dmg(target, xname(target), hurt, FALSE, mdef))
		    continue;
		break;
	    case 1:
		target = which_armor(mdef, W_ARMC);
		if (target) {
		    rust_dmg(target, xname(target), hurt, TRUE, mdef);
		    break;
		}
		if ((target = which_armor(mdef, W_ARM)) != NULL) {
		    rust_dmg(target, xname(target), hurt, TRUE, mdef);
		} else if ((target = which_armor(mdef, W_ARMU)) != NULL) {
		    rust_dmg(target, xname(target), hurt, TRUE, mdef);
		}
		break;
	    case 2:
		target = which_armor(mdef, W_ARMS);
		if (!target || !rust_dmg(target, xname(target), hurt, FALSE, mdef))
		    continue;
		break;
	    case 3:
		target = which_armor(mdef, W_ARMG);
		if (!target || !rust_dmg(target, xname(target), hurt, FALSE, mdef))
		    continue;
		break;
	    case 4:
		target = which_armor(mdef, W_ARMF);
		if (!target || !rust_dmg(target, xname(target), hurt, FALSE, mdef))
		    continue;
		break;
	    }
	    break; /* Out of while loop */
	}
}